

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O1

size_t __thiscall
frozen::bits::pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>::
lookup<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
          (pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>> *this,
          basic_string_view<char,_std::char_traits<char>_> *key,
          elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hasher)

{
  size_t sVar1;
  uint uVar2;
  size_t sVar4;
  ulong uVar3;
  
  sVar1 = key->_M_len;
  uVar3 = (*(ulong *)this ^ 0x811c9dc5) * 0x1000193;
  uVar2 = (uint)uVar3;
  if (sVar1 != 0) {
    sVar4 = 0;
    do {
      uVar3 = ((long)key->_M_str[sVar4] ^ uVar3) * 0x1000193;
      uVar2 = (uint)uVar3;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  uVar3 = *(ulong *)(this + (ulong)(uVar2 >> 5 & 0x1f8) + 8);
  if (-1 < (long)uVar3) {
    return uVar3;
  }
  uVar3 = (uVar3 ^ 0x811c9dc5) * 0x1000193;
  uVar2 = (uint)uVar3;
  if (sVar1 != 0) {
    sVar4 = 0;
    do {
      uVar3 = ((long)key->_M_str[sVar4] ^ uVar3) * 0x1000193;
      uVar2 = (uint)uVar3;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return *(size_t *)(this + (ulong)(uVar2 >> 5 & 0x1f8) + 0x208);
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing uint64 -> size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }